

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::anon_unknown_1::BaseRenderingCase::init
          (BaseRenderingCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  RenderContext *renderCtx;
  int iVar2;
  int extraout_EAX;
  RenderTarget *pRVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  MessageBuilder *pMVar4;
  ShaderProgram *this_00;
  ProgramSources *pPVar5;
  NotSupportedError *pNVar6;
  TestError *this_01;
  float range [2];
  undefined1 local_288 [40];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  undefined1 local_230 [40];
  StringTemplate fragmentSource;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [176];
  pointer local_f8;
  undefined1 uStack_f0;
  undefined7 uStack_ef;
  undefined1 uStack_e8;
  undefined8 uStack_e7;
  
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = pRVar3->m_width;
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  if ((iVar2 < this->m_renderSize) || (pRVar3->m_height < this->m_renderSize)) {
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_230,"Render target size must be at least ",
               (allocator<char> *)&local_1e8);
    de::toString<int>((string *)range,&this->m_renderSize);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)range);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                   "x");
    de::toString<int>(&fragmentSource.m_template,&this->m_renderSize);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                   &fragmentSource.m_template);
    tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_1a8);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if ((this->m_lineWidth != 1.0) || (NAN(this->m_lineWidth))) {
    range[0] = 0.0;
    range[1] = 0.0;
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x818))(0x846e,range);
    if ((this->m_lineWidth < range[0]) || (range[1] < this->m_lineWidth)) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_288,"Support for line width ",(allocator<char> *)&fragmentSource);
      de::toString<float>((string *)local_230,&this->m_lineWidth);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                     " is required.");
      tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_1a8);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"ALIASED_LINE_WIDTH_RANGE = [");
    std::ostream::operator<<(poVar1,range[0]);
    std::operator<<((ostream *)poVar1,", ");
    std::ostream::operator<<(poVar1,range[1]);
    std::operator<<((ostream *)poVar1,"]");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  if ((this->m_pointSize != 1.0) || (NAN(this->m_pointSize))) {
    range[0] = 0.0;
    range[1] = 0.0;
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x818))(0x846d,range);
    if ((this->m_pointSize < range[0]) || (range[1] < this->m_pointSize)) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_288,"Support for point size ",(allocator<char> *)&fragmentSource);
      de::toString<float>((string *)local_230,&this->m_pointSize);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                     " is required.");
      tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_1a8);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"ALIASED_POINT_SIZE_RANGE = [");
    std::ostream::operator<<(poVar1,range[0]);
    std::operator<<((ostream *)poVar1,", ");
    std::ostream::operator<<(poVar1,range[1]);
    std::operator<<((ostream *)poVar1,"]");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  this->m_numSamples = pRVar3->m_numSamples;
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_01,iVar2) + 0x868))(0xd50,&this->m_subpixelBits);
  local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Sample count = ");
  pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a8,&this->m_numSamples);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"SUBPIXEL_BITS = ");
  pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a8,&this->m_subpixelBits);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_color;\nvarying highp vec4 v_color;\nuniform highp float u_pointSize;\nvoid main ()\n{\n\tgl_Position = a_position;\n\tgl_PointSize = u_pointSize;\n\tv_color = a_color;\n}\n"
             ,(allocator<char> *)&params);
  tcu::StringTemplate::StringTemplate((StringTemplate *)range,(string *)local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,
             "varying mediump vec4 v_color;\nvoid main ()\n{\n\tgl_FragColor = v_color;\n}\n",
             (allocator<char> *)&params);
  tcu::StringTemplate::StringTemplate(&fragmentSource,(string *)local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &params._M_t._M_impl.super__Rb_tree_header._M_header;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_1a8,0,0xac);
  local_f8 = (pointer)0x0;
  uStack_f0 = 0;
  uStack_ef = 0;
  uStack_e8 = 0;
  uStack_e7 = 0;
  tcu::StringTemplate::specialize(&local_1e8,(StringTemplate *)range,&params);
  glu::VertexSource::VertexSource((VertexSource *)local_288,&local_1e8);
  pPVar5 = glu::ProgramSources::operator<<((ProgramSources *)local_1a8,(ShaderSource *)local_288);
  tcu::StringTemplate::specialize(&local_1c8,&fragmentSource,&params);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_230,&local_1c8);
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_230);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,pPVar5);
  this->m_shader = this_00;
  std::__cxx11::string::~string((string *)(local_230 + 8));
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)(local_288 + 8));
  std::__cxx11::string::~string((string *)&local_1e8);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_1a8);
  if ((this->m_shader->m_program).m_info.linkOk != false) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&params._M_t);
    tcu::StringTemplate::~StringTemplate(&fragmentSource);
    tcu::StringTemplate::~StringTemplate((StringTemplate *)range);
    return extraout_EAX;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,"could not create shader",(allocator<char> *)local_288);
  tcu::TestError::TestError(this_01,(string *)local_1a8);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BaseRenderingCase::init (void)
{
	const int width	 = m_context.getRenderTarget().getWidth();
	const int height = m_context.getRenderTarget().getHeight();

	// Requirements

	if (width < m_renderSize || height < m_renderSize)
		throw tcu::NotSupportedError(std::string("Render target size must be at least ") + de::toString(m_renderSize) + "x" + de::toString(m_renderSize));

	if (m_lineWidth != 1.0f)
	{
		float range[2] = { 0.0f, 0.0f };
		m_context.getRenderContext().getFunctions().getFloatv(GL_ALIASED_LINE_WIDTH_RANGE, range);

		if (m_lineWidth < range[0] || m_lineWidth > range[1])
			throw tcu::NotSupportedError(std::string("Support for line width ") + de::toString(m_lineWidth) + " is required.");

		m_testCtx.getLog() << tcu::TestLog::Message << "ALIASED_LINE_WIDTH_RANGE = [" << range[0] << ", " << range[1] << "]" << tcu::TestLog::EndMessage;
	}

	if (m_pointSize != 1.0f)
	{
		float range[2] = { 0.0f, 0.0f };
		m_context.getRenderContext().getFunctions().getFloatv(GL_ALIASED_POINT_SIZE_RANGE, range);

		if (m_pointSize < range[0] || m_pointSize > range[1])
			throw tcu::NotSupportedError(std::string("Support for point size ") + de::toString(m_pointSize) + " is required.");

		m_testCtx.getLog() << tcu::TestLog::Message << "ALIASED_POINT_SIZE_RANGE = [" << range[0] << ", " << range[1] << "]" << tcu::TestLog::EndMessage;
	}

	// Query info

	m_numSamples = m_context.getRenderTarget().getNumSamples();
	m_context.getRenderContext().getFunctions().getIntegerv(GL_SUBPIXEL_BITS, &m_subpixelBits);

	m_testCtx.getLog() << tcu::TestLog::Message << "Sample count = " << m_numSamples << tcu::TestLog::EndMessage;
	m_testCtx.getLog() << tcu::TestLog::Message << "SUBPIXEL_BITS = " << m_subpixelBits << tcu::TestLog::EndMessage;

	// Gen shader

	{
		tcu::StringTemplate					vertexSource	(s_shaderVertexTemplate);
		tcu::StringTemplate					fragmentSource	(s_shaderFragmentTemplate);
		std::map<std::string, std::string>	params;

		m_shader = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(vertexSource.specialize(params)) << glu::FragmentSource(fragmentSource.specialize(params)));
		if (!m_shader->isOk())
			throw tcu::TestError("could not create shader");
	}
}